

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O0

void __thiscall
CodeGenerator::CodeGenerator
          (CodeGenerator *this,
          vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> *p)

{
  undefined1 local_48 [56];
  vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> *p_local;
  CodeGenerator *this_local;
  
  local_48._48_8_ = p;
  p_local = &this->lagrange_polynomial;
  std::vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>::vector
            (&this->lagrange_polynomial);
  std::__cxx11::string::string((string *)&this->func);
  std::vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>::operator=
            (&this->lagrange_polynomial,p);
  get_polynomial_string_abi_cxx11_((CodeGenerator *)local_48);
  std::__cxx11::string::operator=((string *)&this->func,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

CodeGenerator::CodeGenerator(vector<LagrangePolynomial::element> p) {
    CodeGenerator::lagrange_polynomial = p;
    CodeGenerator::func = get_polynomial_string();
}